

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_130::dynamicCheckListDefaults<capnp::DynamicStruct::Reader>
               (Reader reader)

{
  bool bVar1;
  ReaderFor<bool> RVar2;
  ReaderFor<unsigned_char> RVar3;
  ReaderFor<unsigned_short> RVar4;
  uint uVar5;
  ReaderFor<unsigned_int> RVar6;
  int32_t iVar7;
  ReaderFor<unsigned_long> RVar8;
  ulong uVar9;
  ArrayPtr<const_char> AVar10;
  initializer_list<int> expected;
  initializer_list<int> expected_00;
  initializer_list<int> expected_01;
  initializer_list<capnp::Text::Reader> expected_02;
  initializer_list<capnp::Text::Reader> expected_03;
  initializer_list<capnp::Text::Reader> expected_04;
  Reader local_3b78;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_3b30;
  int32_t local_3afc;
  int local_3af8;
  bool local_3af1;
  undefined1 local_3af0 [7];
  bool _kj_shouldLog_18;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_3aa8;
  uint local_3a78;
  uint local_3a74;
  Fault local_3a70;
  Fault f_11;
  ReaderFor<capnp::DynamicList> local_3a20;
  Reader local_39e0;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_3998;
  int32_t local_3964;
  int local_3960;
  bool local_3959;
  undefined1 local_3958 [7];
  bool _kj_shouldLog_17;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_3910;
  Reader local_38e0;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_3898;
  int32_t local_3864;
  int local_3860;
  bool local_3859;
  undefined1 local_3858 [7];
  bool _kj_shouldLog_16;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_3810;
  uint local_37e0;
  uint local_37dc;
  Fault local_37d8;
  Fault f_10;
  undefined1 local_3788 [8];
  ReaderFor<capnp::DynamicList> e;
  Fault local_3740;
  Fault f_9;
  Reader local_3728;
  undefined1 local_36e0 [8];
  ReaderFor<capnp::DynamicList> l_2;
  Reader local_3690;
  int *local_3680;
  undefined8 local_3678;
  Reader local_3670;
  undefined1 local_3628 [32];
  Reader local_3608;
  undefined1 local_35c0 [48];
  Reader local_3590;
  uint local_3548;
  uint local_3544;
  Fault local_3540;
  Fault f_8;
  Reader local_3528;
  undefined1 local_34e0 [8];
  ReaderFor<capnp::DynamicList> l_1;
  Reader local_3488;
  undefined1 local_3440 [100];
  undefined1 local_33dc [100];
  uint local_3378;
  uint local_3374;
  Fault local_3370;
  Fault f_7;
  Reader local_3358;
  undefined1 local_3310 [8];
  ReaderFor<capnp::DynamicList> l;
  ArrayPtr<const_char> local_32c0;
  Reader local_32b0;
  ReaderFor<capnp::DynamicList> local_3268;
  Reader local_3228;
  ReaderFor<capnp::DynamicStruct> local_31e0;
  Reader local_31a8;
  ArrayPtr<const_char> local_3160;
  bool local_3149;
  undefined1 auStack_3148 [7];
  bool _kj_shouldLog_15;
  ArrayPtr<const_char> local_3138;
  Reader local_3128;
  ReaderFor<capnp::DynamicList> local_30e0;
  Reader local_30a0;
  ReaderFor<capnp::DynamicStruct> local_3058;
  Reader local_3020;
  ArrayPtr<const_char> local_2fd8;
  ArrayPtr<const_char> local_2fc8;
  ArrayPtr<const_char> local_2fb8;
  Reader local_2fa8;
  ReaderFor<capnp::DynamicList> local_2f60;
  Reader local_2f20;
  ReaderFor<capnp::DynamicStruct> local_2ed8;
  Reader local_2ea0;
  ArrayPtr<const_char> local_2e58;
  bool local_2e41;
  undefined1 auStack_2e40 [7];
  bool _kj_shouldLog_14;
  ArrayPtr<const_char> local_2e30;
  Reader local_2e20;
  ReaderFor<capnp::DynamicList> local_2dd8;
  Reader local_2d98;
  ReaderFor<capnp::DynamicStruct> local_2d50;
  Reader local_2d18;
  ArrayPtr<const_char> local_2cd0;
  ArrayPtr<const_char> local_2cc0;
  ArrayPtr<const_char> local_2cb0;
  Reader local_2ca0;
  ReaderFor<capnp::DynamicList> local_2c58;
  Reader local_2c18;
  ReaderFor<capnp::DynamicStruct> local_2bd0;
  Reader local_2b98;
  ReaderFor<unsigned_long> local_2b50;
  unsigned_long local_2b48;
  bool local_2b39;
  undefined1 auStack_2b38 [7];
  bool _kj_shouldLog_13;
  ArrayPtr<const_char> local_2b28;
  Reader local_2b18;
  ReaderFor<capnp::DynamicList> local_2ad0;
  Reader local_2a90;
  ReaderFor<capnp::DynamicStruct> local_2a48;
  Reader local_2a10;
  ArrayPtr<const_char> local_29c8;
  ArrayPtr<const_char> local_29b8;
  Reader local_29a8;
  ReaderFor<capnp::DynamicList> local_2960;
  Reader local_2920;
  ReaderFor<capnp::DynamicStruct> local_28d8;
  Reader local_28a0;
  ReaderFor<unsigned_long> local_2858;
  unsigned_long local_2850;
  bool local_2841;
  undefined1 auStack_2840 [7];
  bool _kj_shouldLog_12;
  ArrayPtr<const_char> local_2830;
  Reader local_2820;
  ReaderFor<capnp::DynamicList> local_27d8;
  Reader local_2798;
  ReaderFor<capnp::DynamicStruct> local_2750;
  Reader local_2718;
  ArrayPtr<const_char> local_26d0;
  ArrayPtr<const_char> local_26c0;
  Reader local_26b0;
  ReaderFor<capnp::DynamicList> local_2668;
  Reader local_2628;
  ReaderFor<capnp::DynamicStruct> local_25e0;
  Reader local_25a8;
  ReaderFor<unsigned_int> local_255c;
  uint local_2558;
  bool local_2551;
  undefined1 auStack_2550 [7];
  bool _kj_shouldLog_11;
  ArrayPtr<const_char> local_2540;
  Reader local_2530;
  ReaderFor<capnp::DynamicList> local_24e8;
  Reader local_24a8;
  ReaderFor<capnp::DynamicStruct> local_2460;
  Reader local_2428;
  ArrayPtr<const_char> local_23e0;
  ArrayPtr<const_char> local_23d0;
  Reader local_23c0;
  ReaderFor<capnp::DynamicList> local_2378;
  Reader local_2338;
  ReaderFor<capnp::DynamicStruct> local_22f0;
  Reader local_22b8;
  ReaderFor<unsigned_int> local_226c;
  uint local_2268;
  bool local_2261;
  undefined1 auStack_2260 [7];
  bool _kj_shouldLog_10;
  ArrayPtr<const_char> local_2250;
  Reader local_2240;
  ReaderFor<capnp::DynamicList> local_21f8;
  Reader local_21b8;
  ReaderFor<capnp::DynamicStruct> local_2170;
  Reader local_2138;
  ArrayPtr<const_char> local_20f0;
  ArrayPtr<const_char> local_20e0;
  Reader local_20d0;
  ReaderFor<capnp::DynamicList> local_2088;
  Reader local_2048;
  ReaderFor<capnp::DynamicStruct> local_2000;
  Reader local_1fc8;
  ReaderFor<unsigned_short> local_1f7a;
  uint local_1f78;
  bool local_1f71;
  undefined1 auStack_1f70 [7];
  bool _kj_shouldLog_9;
  ArrayPtr<const_char> local_1f60;
  Reader local_1f50;
  ReaderFor<capnp::DynamicList> local_1f08;
  Reader local_1ec8;
  ReaderFor<capnp::DynamicStruct> local_1e80;
  Reader local_1e48;
  ArrayPtr<const_char> local_1e00;
  ArrayPtr<const_char> local_1df0;
  Reader local_1de0;
  ReaderFor<capnp::DynamicList> local_1d98;
  Reader local_1d58;
  ReaderFor<capnp::DynamicStruct> local_1d10;
  Reader local_1cd8;
  ReaderFor<unsigned_short> local_1c8a;
  uint local_1c88;
  bool local_1c81;
  undefined1 auStack_1c80 [7];
  bool _kj_shouldLog_8;
  ArrayPtr<const_char> local_1c70;
  Reader local_1c60;
  ReaderFor<capnp::DynamicList> local_1c18;
  Reader local_1bd8;
  ReaderFor<capnp::DynamicStruct> local_1b90;
  Reader local_1b58;
  ArrayPtr<const_char> local_1b10;
  ArrayPtr<const_char> local_1b00;
  Reader local_1af0;
  ReaderFor<capnp::DynamicList> local_1aa8;
  Reader local_1a68;
  ReaderFor<capnp::DynamicStruct> local_1a20;
  Reader local_19e8;
  ReaderFor<unsigned_char> local_1999;
  uint local_1998;
  bool local_1991;
  undefined1 auStack_1990 [7];
  bool _kj_shouldLog_7;
  ArrayPtr<const_char> local_1980;
  Reader local_1970;
  ReaderFor<capnp::DynamicList> local_1928;
  Reader local_18e8;
  ReaderFor<capnp::DynamicStruct> local_18a0;
  Reader local_1868;
  ArrayPtr<const_char> local_1820;
  ArrayPtr<const_char> local_1810;
  Reader local_1800;
  ReaderFor<capnp::DynamicList> local_17b8;
  Reader local_1778;
  ReaderFor<capnp::DynamicStruct> local_1730;
  Reader local_16f8;
  ReaderFor<unsigned_char> local_16a9;
  uint local_16a8;
  bool local_16a1;
  undefined1 auStack_16a0 [7];
  bool _kj_shouldLog_6;
  ArrayPtr<const_char> local_1690;
  Reader local_1680;
  ReaderFor<capnp::DynamicList> local_1638;
  Reader local_15f8;
  ReaderFor<capnp::DynamicStruct> local_15b0;
  Reader local_1578;
  bool local_1529;
  undefined1 auStack_1528 [7];
  bool _kj_shouldLog_5;
  ArrayPtr<const_char> local_1518;
  Reader local_1508;
  ReaderFor<capnp::DynamicList> local_14c0;
  Reader local_1480;
  ReaderFor<capnp::DynamicStruct> local_1438;
  Reader local_1400;
  bool local_13b1;
  undefined1 auStack_13b0 [7];
  bool _kj_shouldLog_4;
  ArrayPtr<const_char> local_13a0;
  Reader local_1390;
  ReaderFor<capnp::DynamicList> local_1348;
  Reader local_1308;
  ReaderFor<capnp::DynamicStruct> local_12c0;
  Reader local_1288;
  bool local_1239;
  undefined1 auStack_1238 [7];
  bool _kj_shouldLog_3;
  ArrayPtr<const_char> local_1228;
  Reader local_1218;
  ReaderFor<capnp::DynamicList> local_11d0;
  Reader local_1190;
  ReaderFor<capnp::DynamicStruct> local_1148;
  Reader local_1110;
  bool local_10c1;
  undefined1 auStack_10c0 [7];
  bool _kj_shouldLog_2;
  ArrayPtr<const_char> local_10b0;
  Reader local_10a0;
  ReaderFor<capnp::DynamicList> local_1058;
  Reader local_1018;
  ReaderFor<capnp::DynamicStruct> local_fd0;
  Reader local_f98;
  ArrayPtr<const_char> local_f48;
  ArrayPtr<const_char> local_f38;
  Reader local_f28;
  ReaderFor<capnp::DynamicList> local_ee0;
  Reader local_ea0;
  ReaderFor<capnp::DynamicStruct> local_e58;
  Reader local_e20;
  Void local_dd3;
  bool local_dd2;
  undefined1 auStack_dd0 [6];
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_dc0;
  Reader local_db0;
  ReaderFor<capnp::DynamicList> local_d68;
  Reader local_d28;
  ReaderFor<capnp::DynamicStruct> local_ce0;
  Reader local_ca8;
  ArrayPtr<const_char> local_c58;
  ArrayPtr<const_char> local_c48;
  Reader local_c38;
  ReaderFor<capnp::DynamicList> local_bf0;
  Reader local_bb0;
  ReaderFor<capnp::DynamicStruct> local_b68;
  Reader local_b30;
  Void local_ae3;
  bool local_ae2;
  undefined1 auStack_ae0 [6];
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_ad0;
  Reader local_ac0;
  ReaderFor<capnp::DynamicList> local_a78;
  Reader local_a38;
  ReaderFor<capnp::DynamicStruct> local_9f0;
  Reader local_9b8;
  ArrayPtr<const_char> local_968;
  Reader local_958;
  ReaderFor<capnp::DynamicList> local_910;
  uint local_8d0;
  uint local_8cc;
  Fault local_8c8;
  Fault f_6;
  Reader local_8b0;
  ReaderFor<capnp::DynamicList> local_868;
  ArrayPtr<const_char> local_828;
  Reader local_818;
  ReaderFor<capnp::DynamicList> local_7d0;
  uint local_790;
  uint local_78c;
  Fault local_788;
  Fault f_5;
  Reader local_770;
  ReaderFor<capnp::DynamicList> local_728;
  ArrayPtr<const_char> local_6e8;
  Reader local_6d8;
  ReaderFor<capnp::DynamicList> local_690;
  uint local_650;
  uint local_64c;
  Fault local_648;
  Fault f_4;
  Reader local_630;
  ReaderFor<capnp::DynamicList> local_5e8;
  ArrayPtr<const_char> local_5a8;
  Reader local_598;
  ReaderFor<capnp::DynamicList> local_550;
  uint local_510;
  uint local_50c;
  Fault local_508;
  Fault f_3;
  Reader local_4f0;
  ReaderFor<capnp::DynamicList> local_4a8;
  ArrayPtr<const_char> local_468;
  Reader local_458;
  ReaderFor<capnp::DynamicList> local_410;
  uint local_3d0;
  uint local_3cc;
  Fault local_3c8;
  Fault f_2;
  Reader local_3b0;
  ReaderFor<capnp::DynamicList> local_368;
  ArrayPtr<const_char> local_328;
  Reader local_318;
  ReaderFor<capnp::DynamicList> local_2d0;
  uint local_290;
  uint local_28c;
  Fault local_288;
  Fault f_1;
  Reader local_270;
  ReaderFor<capnp::DynamicList> local_228;
  ArrayPtr<const_char> local_1e8;
  Reader local_1d8;
  ReaderFor<capnp::DynamicList> local_190;
  uint local_150;
  uint local_14c;
  Fault local_148;
  Fault f;
  Reader local_130;
  ReaderFor<capnp::DynamicList> local_e8;
  ArrayPtr<const_char> local_98;
  Reader local_88;
  undefined1 local_40 [8];
  ReaderFor<capnp::DynamicStruct> lists;
  
  kj::StringPtr::StringPtr((StringPtr *)&local_98,"lists");
  DynamicStruct::Reader::get(&local_88,(Reader *)&stack0x00000008,(StringPtr)local_98);
  DynamicValue::Reader::as<capnp::DynamicStruct>
            ((ReaderFor<capnp::DynamicStruct> *)local_40,&local_88);
  DynamicValue::Reader::~Reader(&local_88);
  kj::StringPtr::StringPtr((StringPtr *)&f,"list0");
  DynamicStruct::Reader::get(&local_130,(Reader *)local_40,(StringPtr)_f);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_e8,&local_130);
  uVar5 = DynamicList::Reader::size(&local_e8);
  DynamicValue::Reader::~Reader(&local_130);
  if (uVar5 != 2) {
    local_14c = 2;
    kj::StringPtr::StringPtr((StringPtr *)&local_1e8,"list0");
    DynamicStruct::Reader::get(&local_1d8,(Reader *)local_40,(StringPtr)local_1e8);
    DynamicValue::Reader::as<capnp::DynamicList>(&local_190,&local_1d8);
    local_150 = DynamicList::Reader::size(&local_190);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_148,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x306,FAILED,"(2u) == (lists.get(\"list0\").template as<DynamicList>().size())",
               "2u, lists.get(\"list0\").template as<DynamicList>().size()",&local_14c,&local_150);
    DynamicValue::Reader::~Reader(&local_1d8);
    kj::_::Debug::Fault::fatal(&local_148);
  }
  kj::StringPtr::StringPtr((StringPtr *)&f_1,"list1");
  DynamicStruct::Reader::get(&local_270,(Reader *)local_40,(StringPtr)_f_1);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_228,&local_270);
  uVar5 = DynamicList::Reader::size(&local_228);
  DynamicValue::Reader::~Reader(&local_270);
  if (uVar5 != 4) {
    local_28c = 4;
    kj::StringPtr::StringPtr((StringPtr *)&local_328,"list1");
    DynamicStruct::Reader::get(&local_318,(Reader *)local_40,(StringPtr)local_328);
    DynamicValue::Reader::as<capnp::DynamicList>(&local_2d0,&local_318);
    local_290 = DynamicList::Reader::size(&local_2d0);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_288,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x307,FAILED,"(4u) == (lists.get(\"list1\").template as<DynamicList>().size())",
               "4u, lists.get(\"list1\").template as<DynamicList>().size()",&local_28c,&local_290);
    DynamicValue::Reader::~Reader(&local_318);
    kj::_::Debug::Fault::fatal(&local_288);
  }
  kj::StringPtr::StringPtr((StringPtr *)&f_2,"list8");
  DynamicStruct::Reader::get(&local_3b0,(Reader *)local_40,(StringPtr)_f_2);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_368,&local_3b0);
  uVar5 = DynamicList::Reader::size(&local_368);
  DynamicValue::Reader::~Reader(&local_3b0);
  if (uVar5 != 2) {
    local_3cc = 2;
    kj::StringPtr::StringPtr((StringPtr *)&local_468,"list8");
    DynamicStruct::Reader::get(&local_458,(Reader *)local_40,(StringPtr)local_468);
    DynamicValue::Reader::as<capnp::DynamicList>(&local_410,&local_458);
    local_3d0 = DynamicList::Reader::size(&local_410);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_3c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x308,FAILED,"(2u) == (lists.get(\"list8\").template as<DynamicList>().size())",
               "2u, lists.get(\"list8\").template as<DynamicList>().size()",&local_3cc,&local_3d0);
    DynamicValue::Reader::~Reader(&local_458);
    kj::_::Debug::Fault::fatal(&local_3c8);
  }
  kj::StringPtr::StringPtr((StringPtr *)&f_3,"list16");
  DynamicStruct::Reader::get(&local_4f0,(Reader *)local_40,(StringPtr)_f_3);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_4a8,&local_4f0);
  uVar5 = DynamicList::Reader::size(&local_4a8);
  DynamicValue::Reader::~Reader(&local_4f0);
  if (uVar5 != 2) {
    local_50c = 2;
    kj::StringPtr::StringPtr((StringPtr *)&local_5a8,"list16");
    DynamicStruct::Reader::get(&local_598,(Reader *)local_40,(StringPtr)local_5a8);
    DynamicValue::Reader::as<capnp::DynamicList>(&local_550,&local_598);
    local_510 = DynamicList::Reader::size(&local_550);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_508,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x309,FAILED,"(2u) == (lists.get(\"list16\").template as<DynamicList>().size())",
               "2u, lists.get(\"list16\").template as<DynamicList>().size()",&local_50c,&local_510);
    DynamicValue::Reader::~Reader(&local_598);
    kj::_::Debug::Fault::fatal(&local_508);
  }
  kj::StringPtr::StringPtr((StringPtr *)&f_4,"list32");
  DynamicStruct::Reader::get(&local_630,(Reader *)local_40,(StringPtr)_f_4);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_5e8,&local_630);
  uVar5 = DynamicList::Reader::size(&local_5e8);
  DynamicValue::Reader::~Reader(&local_630);
  if (uVar5 != 2) {
    local_64c = 2;
    kj::StringPtr::StringPtr((StringPtr *)&local_6e8,"list32");
    DynamicStruct::Reader::get(&local_6d8,(Reader *)local_40,(StringPtr)local_6e8);
    DynamicValue::Reader::as<capnp::DynamicList>(&local_690,&local_6d8);
    local_650 = DynamicList::Reader::size(&local_690);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_648,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x30a,FAILED,"(2u) == (lists.get(\"list32\").template as<DynamicList>().size())",
               "2u, lists.get(\"list32\").template as<DynamicList>().size()",&local_64c,&local_650);
    DynamicValue::Reader::~Reader(&local_6d8);
    kj::_::Debug::Fault::fatal(&local_648);
  }
  kj::StringPtr::StringPtr((StringPtr *)&f_5,"list64");
  DynamicStruct::Reader::get(&local_770,(Reader *)local_40,(StringPtr)_f_5);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_728,&local_770);
  uVar5 = DynamicList::Reader::size(&local_728);
  DynamicValue::Reader::~Reader(&local_770);
  if (uVar5 != 2) {
    local_78c = 2;
    kj::StringPtr::StringPtr((StringPtr *)&local_828,"list64");
    DynamicStruct::Reader::get(&local_818,(Reader *)local_40,(StringPtr)local_828);
    DynamicValue::Reader::as<capnp::DynamicList>(&local_7d0,&local_818);
    local_790 = DynamicList::Reader::size(&local_7d0);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_788,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x30b,FAILED,"(2u) == (lists.get(\"list64\").template as<DynamicList>().size())",
               "2u, lists.get(\"list64\").template as<DynamicList>().size()",&local_78c,&local_790);
    DynamicValue::Reader::~Reader(&local_818);
    kj::_::Debug::Fault::fatal(&local_788);
  }
  kj::StringPtr::StringPtr((StringPtr *)&f_6,"listP");
  DynamicStruct::Reader::get(&local_8b0,(Reader *)local_40,(StringPtr)_f_6);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_868,&local_8b0);
  uVar5 = DynamicList::Reader::size(&local_868);
  DynamicValue::Reader::~Reader(&local_8b0);
  if (uVar5 != 2) {
    local_8cc = 2;
    kj::StringPtr::StringPtr((StringPtr *)&local_968,"listP");
    DynamicStruct::Reader::get(&local_958,(Reader *)local_40,(StringPtr)local_968);
    DynamicValue::Reader::as<capnp::DynamicList>(&local_910,&local_958);
    local_8d0 = DynamicList::Reader::size(&local_910);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_8c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x30c,FAILED,"(2u) == (lists.get(\"listP\").template as<DynamicList>().size())",
               "2u, lists.get(\"listP\").template as<DynamicList>().size()",&local_8cc,&local_8d0);
    DynamicValue::Reader::~Reader(&local_958);
    kj::_::Debug::Fault::fatal(&local_8c8);
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_ad0,"list0");
  DynamicStruct::Reader::get(&local_ac0,(Reader *)local_40,(StringPtr)local_ad0);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_a78,&local_ac0);
  DynamicList::Reader::operator[](&local_a38,&local_a78,0);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_9f0,&local_a38);
  kj::StringPtr::StringPtr((StringPtr *)auStack_ae0,"f");
  DynamicStruct::Reader::get(&local_9b8,&local_9f0,(StringPtr)_auStack_ae0);
  DynamicValue::Reader::as<capnp::Void>(&local_9b8);
  bVar1 = Void::operator==((Void *)&VOID);
  DynamicValue::Reader::~Reader(&local_9b8);
  DynamicValue::Reader::~Reader(&local_a38);
  DynamicValue::Reader::~Reader(&local_ac0);
  if (!bVar1) {
    local_ae2 = kj::_::Debug::shouldLog(ERROR);
    while (local_ae2 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_c48,"list0");
      DynamicStruct::Reader::get(&local_c38,(Reader *)local_40,(StringPtr)local_c48);
      DynamicValue::Reader::as<capnp::DynamicList>(&local_bf0,&local_c38);
      DynamicList::Reader::operator[](&local_bb0,&local_bf0,0);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_b68,&local_bb0);
      kj::StringPtr::StringPtr((StringPtr *)&local_c58,"f");
      DynamicStruct::Reader::get(&local_b30,&local_b68,(StringPtr)local_c58);
      DynamicValue::Reader::as<capnp::Void>(&local_b30);
      kj::_::Debug::log<char_const(&)[136],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x30e,ERROR,
                 "\"failed: expected \" \"(VOID) == (lists.get(\\\"list0\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<Void>())\", VOID, lists.get(\"list0\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<Void>()"
                 ,(char (*) [136])
                  "failed: expected (VOID) == (lists.get(\"list0\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<Void>())"
                 ,(Void *)&VOID,&local_ae3);
      DynamicValue::Reader::~Reader(&local_b30);
      DynamicValue::Reader::~Reader(&local_bb0);
      DynamicValue::Reader::~Reader(&local_c38);
      local_ae2 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_dc0,"list0");
  DynamicStruct::Reader::get(&local_db0,(Reader *)local_40,(StringPtr)local_dc0);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_d68,&local_db0);
  DynamicList::Reader::operator[](&local_d28,&local_d68,1);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_ce0,&local_d28);
  kj::StringPtr::StringPtr((StringPtr *)auStack_dd0,"f");
  DynamicStruct::Reader::get(&local_ca8,&local_ce0,(StringPtr)_auStack_dd0);
  DynamicValue::Reader::as<capnp::Void>(&local_ca8);
  bVar1 = Void::operator==((Void *)&VOID);
  DynamicValue::Reader::~Reader(&local_ca8);
  DynamicValue::Reader::~Reader(&local_d28);
  DynamicValue::Reader::~Reader(&local_db0);
  if (!bVar1) {
    local_dd2 = kj::_::Debug::shouldLog(ERROR);
    while (local_dd2 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_f38,"list0");
      DynamicStruct::Reader::get(&local_f28,(Reader *)local_40,(StringPtr)local_f38);
      DynamicValue::Reader::as<capnp::DynamicList>(&local_ee0,&local_f28);
      DynamicList::Reader::operator[](&local_ea0,&local_ee0,1);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_e58,&local_ea0);
      kj::StringPtr::StringPtr((StringPtr *)&local_f48,"f");
      DynamicStruct::Reader::get(&local_e20,&local_e58,(StringPtr)local_f48);
      DynamicValue::Reader::as<capnp::Void>(&local_e20);
      kj::_::Debug::log<char_const(&)[136],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x30f,ERROR,
                 "\"failed: expected \" \"(VOID) == (lists.get(\\\"list0\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<Void>())\", VOID, lists.get(\"list0\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<Void>()"
                 ,(char (*) [136])
                  "failed: expected (VOID) == (lists.get(\"list0\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<Void>())"
                 ,(Void *)&VOID,&local_dd3);
      DynamicValue::Reader::~Reader(&local_e20);
      DynamicValue::Reader::~Reader(&local_ea0);
      DynamicValue::Reader::~Reader(&local_f28);
      local_dd2 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_10b0,"list1");
  DynamicStruct::Reader::get(&local_10a0,(Reader *)local_40,(StringPtr)local_10b0);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_1058,&local_10a0);
  DynamicList::Reader::operator[](&local_1018,&local_1058,0);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_fd0,&local_1018);
  kj::StringPtr::StringPtr((StringPtr *)auStack_10c0,"f");
  DynamicStruct::Reader::get(&local_f98,&local_fd0,(StringPtr)_auStack_10c0);
  RVar2 = DynamicValue::Reader::as<bool>(&local_f98);
  DynamicValue::Reader::~Reader(&local_f98);
  DynamicValue::Reader::~Reader(&local_1018);
  DynamicValue::Reader::~Reader(&local_10a0);
  if (!RVar2) {
    local_10c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_10c1 != false) {
      kj::_::Debug::log<char_const(&)[124]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x310,ERROR,
                 "\"failed: expected \" \"lists.get(\\\"list1\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>()\""
                 ,(char (*) [124])
                  "failed: expected lists.get(\"list1\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<bool>()"
                );
      local_10c1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_1228,"list1");
  DynamicStruct::Reader::get(&local_1218,(Reader *)local_40,(StringPtr)local_1228);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_11d0,&local_1218);
  DynamicList::Reader::operator[](&local_1190,&local_11d0,1);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_1148,&local_1190);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1238,"f");
  DynamicStruct::Reader::get(&local_1110,&local_1148,(StringPtr)_auStack_1238);
  RVar2 = DynamicValue::Reader::as<bool>(&local_1110);
  DynamicValue::Reader::~Reader(&local_1110);
  DynamicValue::Reader::~Reader(&local_1190);
  DynamicValue::Reader::~Reader(&local_1218);
  if (RVar2) {
    local_1239 = kj::_::Debug::shouldLog(ERROR);
    while (local_1239 != false) {
      kj::_::Debug::log<char_const(&)[127]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x311,ERROR,
                 "\"failed: expected \" \"!(lists.get(\\\"list1\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>())\""
                 ,(char (*) [127])
                  "failed: expected !(lists.get(\"list1\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<bool>())"
                );
      local_1239 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_13a0,"list1");
  DynamicStruct::Reader::get(&local_1390,(Reader *)local_40,(StringPtr)local_13a0);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_1348,&local_1390);
  DynamicList::Reader::operator[](&local_1308,&local_1348,2);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_12c0,&local_1308);
  kj::StringPtr::StringPtr((StringPtr *)auStack_13b0,"f");
  DynamicStruct::Reader::get(&local_1288,&local_12c0,(StringPtr)_auStack_13b0);
  RVar2 = DynamicValue::Reader::as<bool>(&local_1288);
  DynamicValue::Reader::~Reader(&local_1288);
  DynamicValue::Reader::~Reader(&local_1308);
  DynamicValue::Reader::~Reader(&local_1390);
  if (!RVar2) {
    local_13b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_13b1 != false) {
      kj::_::Debug::log<char_const(&)[124]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x312,ERROR,
                 "\"failed: expected \" \"lists.get(\\\"list1\\\").template as<DynamicList>()[2].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>()\""
                 ,(char (*) [124])
                  "failed: expected lists.get(\"list1\").template as<DynamicList>()[2].template as<DynamicStruct>().get(\"f\").template as<bool>()"
                );
      local_13b1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_1518,"list1");
  DynamicStruct::Reader::get(&local_1508,(Reader *)local_40,(StringPtr)local_1518);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_14c0,&local_1508);
  DynamicList::Reader::operator[](&local_1480,&local_14c0,3);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_1438,&local_1480);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1528,"f");
  DynamicStruct::Reader::get(&local_1400,&local_1438,(StringPtr)_auStack_1528);
  RVar2 = DynamicValue::Reader::as<bool>(&local_1400);
  DynamicValue::Reader::~Reader(&local_1400);
  DynamicValue::Reader::~Reader(&local_1480);
  DynamicValue::Reader::~Reader(&local_1508);
  if (!RVar2) {
    local_1529 = kj::_::Debug::shouldLog(ERROR);
    while (local_1529 != false) {
      kj::_::Debug::log<char_const(&)[124]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x313,ERROR,
                 "\"failed: expected \" \"lists.get(\\\"list1\\\").template as<DynamicList>()[3].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>()\""
                 ,(char (*) [124])
                  "failed: expected lists.get(\"list1\").template as<DynamicList>()[3].template as<DynamicStruct>().get(\"f\").template as<bool>()"
                );
      local_1529 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_1690,"list8");
  DynamicStruct::Reader::get(&local_1680,(Reader *)local_40,(StringPtr)local_1690);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_1638,&local_1680);
  DynamicList::Reader::operator[](&local_15f8,&local_1638,0);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_15b0,&local_15f8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_16a0,"f");
  DynamicStruct::Reader::get(&local_1578,&local_15b0,(StringPtr)_auStack_16a0);
  RVar3 = DynamicValue::Reader::as<unsigned_char>(&local_1578);
  DynamicValue::Reader::~Reader(&local_1578);
  DynamicValue::Reader::~Reader(&local_15f8);
  DynamicValue::Reader::~Reader(&local_1680);
  if (RVar3 != '{') {
    local_16a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_16a1 != false) {
      local_16a8 = 0x7b;
      kj::StringPtr::StringPtr((StringPtr *)&local_1810,"list8");
      DynamicStruct::Reader::get(&local_1800,(Reader *)local_40,(StringPtr)local_1810);
      DynamicValue::Reader::as<capnp::DynamicList>(&local_17b8,&local_1800);
      DynamicList::Reader::operator[](&local_1778,&local_17b8,0);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_1730,&local_1778);
      kj::StringPtr::StringPtr((StringPtr *)&local_1820,"f");
      DynamicStruct::Reader::get(&local_16f8,&local_1730,(StringPtr)local_1820);
      local_16a9 = DynamicValue::Reader::as<unsigned_char>(&local_16f8);
      kj::_::Debug::log<char_const(&)[139],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x314,ERROR,
                 "\"failed: expected \" \"(123u) == (lists.get(\\\"list8\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint8_t>())\", 123u, lists.get(\"list8\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint8_t>()"
                 ,(char (*) [139])
                  "failed: expected (123u) == (lists.get(\"list8\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint8_t>())"
                 ,&local_16a8,&local_16a9);
      DynamicValue::Reader::~Reader(&local_16f8);
      DynamicValue::Reader::~Reader(&local_1778);
      DynamicValue::Reader::~Reader(&local_1800);
      local_16a1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_1980,"list8");
  DynamicStruct::Reader::get(&local_1970,(Reader *)local_40,(StringPtr)local_1980);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_1928,&local_1970);
  DynamicList::Reader::operator[](&local_18e8,&local_1928,1);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_18a0,&local_18e8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1990,"f");
  DynamicStruct::Reader::get(&local_1868,&local_18a0,(StringPtr)_auStack_1990);
  RVar3 = DynamicValue::Reader::as<unsigned_char>(&local_1868);
  DynamicValue::Reader::~Reader(&local_1868);
  DynamicValue::Reader::~Reader(&local_18e8);
  DynamicValue::Reader::~Reader(&local_1970);
  if (RVar3 != '-') {
    local_1991 = kj::_::Debug::shouldLog(ERROR);
    while (local_1991 != false) {
      local_1998 = 0x2d;
      kj::StringPtr::StringPtr((StringPtr *)&local_1b00,"list8");
      DynamicStruct::Reader::get(&local_1af0,(Reader *)local_40,(StringPtr)local_1b00);
      DynamicValue::Reader::as<capnp::DynamicList>(&local_1aa8,&local_1af0);
      DynamicList::Reader::operator[](&local_1a68,&local_1aa8,1);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_1a20,&local_1a68);
      kj::StringPtr::StringPtr((StringPtr *)&local_1b10,"f");
      DynamicStruct::Reader::get(&local_19e8,&local_1a20,(StringPtr)local_1b10);
      local_1999 = DynamicValue::Reader::as<unsigned_char>(&local_19e8);
      kj::_::Debug::log<char_const(&)[138],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x315,ERROR,
                 "\"failed: expected \" \"(45u) == (lists.get(\\\"list8\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint8_t>())\", 45u, lists.get(\"list8\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint8_t>()"
                 ,(char (*) [138])
                  "failed: expected (45u) == (lists.get(\"list8\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint8_t>())"
                 ,&local_1998,&local_1999);
      DynamicValue::Reader::~Reader(&local_19e8);
      DynamicValue::Reader::~Reader(&local_1a68);
      DynamicValue::Reader::~Reader(&local_1af0);
      local_1991 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_1c70,"list16");
  DynamicStruct::Reader::get(&local_1c60,(Reader *)local_40,(StringPtr)local_1c70);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_1c18,&local_1c60);
  DynamicList::Reader::operator[](&local_1bd8,&local_1c18,0);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_1b90,&local_1bd8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1c80,"f");
  DynamicStruct::Reader::get(&local_1b58,&local_1b90,(StringPtr)_auStack_1c80);
  RVar4 = DynamicValue::Reader::as<unsigned_short>(&local_1b58);
  DynamicValue::Reader::~Reader(&local_1b58);
  DynamicValue::Reader::~Reader(&local_1bd8);
  DynamicValue::Reader::~Reader(&local_1c60);
  if (RVar4 != 0x3039) {
    local_1c81 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c81 != false) {
      local_1c88 = 0x3039;
      kj::StringPtr::StringPtr((StringPtr *)&local_1df0,"list16");
      DynamicStruct::Reader::get(&local_1de0,(Reader *)local_40,(StringPtr)local_1df0);
      DynamicValue::Reader::as<capnp::DynamicList>(&local_1d98,&local_1de0);
      DynamicList::Reader::operator[](&local_1d58,&local_1d98,0);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_1d10,&local_1d58);
      kj::StringPtr::StringPtr((StringPtr *)&local_1e00,"f");
      DynamicStruct::Reader::get(&local_1cd8,&local_1d10,(StringPtr)local_1e00);
      local_1c8a = DynamicValue::Reader::as<unsigned_short>(&local_1cd8);
      kj::_::Debug::log<char_const(&)[143],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x316,ERROR,
                 "\"failed: expected \" \"(12345u) == (lists.get(\\\"list16\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint16_t>())\", 12345u, lists.get(\"list16\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint16_t>()"
                 ,(char (*) [143])
                  "failed: expected (12345u) == (lists.get(\"list16\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint16_t>())"
                 ,&local_1c88,&local_1c8a);
      DynamicValue::Reader::~Reader(&local_1cd8);
      DynamicValue::Reader::~Reader(&local_1d58);
      DynamicValue::Reader::~Reader(&local_1de0);
      local_1c81 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_1f60,"list16");
  DynamicStruct::Reader::get(&local_1f50,(Reader *)local_40,(StringPtr)local_1f60);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_1f08,&local_1f50);
  DynamicList::Reader::operator[](&local_1ec8,&local_1f08,1);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_1e80,&local_1ec8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1f70,"f");
  DynamicStruct::Reader::get(&local_1e48,&local_1e80,(StringPtr)_auStack_1f70);
  RVar4 = DynamicValue::Reader::as<unsigned_short>(&local_1e48);
  DynamicValue::Reader::~Reader(&local_1e48);
  DynamicValue::Reader::~Reader(&local_1ec8);
  DynamicValue::Reader::~Reader(&local_1f50);
  if (RVar4 != 0x1a85) {
    local_1f71 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f71 != false) {
      local_1f78 = 0x1a85;
      kj::StringPtr::StringPtr((StringPtr *)&local_20e0,"list16");
      DynamicStruct::Reader::get(&local_20d0,(Reader *)local_40,(StringPtr)local_20e0);
      DynamicValue::Reader::as<capnp::DynamicList>(&local_2088,&local_20d0);
      DynamicList::Reader::operator[](&local_2048,&local_2088,1);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_2000,&local_2048);
      kj::StringPtr::StringPtr((StringPtr *)&local_20f0,"f");
      DynamicStruct::Reader::get(&local_1fc8,&local_2000,(StringPtr)local_20f0);
      local_1f7a = DynamicValue::Reader::as<unsigned_short>(&local_1fc8);
      kj::_::Debug::log<char_const(&)[142],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x317,ERROR,
                 "\"failed: expected \" \"(6789u) == (lists.get(\\\"list16\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint16_t>())\", 6789u, lists.get(\"list16\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint16_t>()"
                 ,(char (*) [142])
                  "failed: expected (6789u) == (lists.get(\"list16\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint16_t>())"
                 ,&local_1f78,&local_1f7a);
      DynamicValue::Reader::~Reader(&local_1fc8);
      DynamicValue::Reader::~Reader(&local_2048);
      DynamicValue::Reader::~Reader(&local_20d0);
      local_1f71 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_2250,"list32");
  DynamicStruct::Reader::get(&local_2240,(Reader *)local_40,(StringPtr)local_2250);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_21f8,&local_2240);
  DynamicList::Reader::operator[](&local_21b8,&local_21f8,0);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_2170,&local_21b8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2260,"f");
  DynamicStruct::Reader::get(&local_2138,&local_2170,(StringPtr)_auStack_2260);
  RVar6 = DynamicValue::Reader::as<unsigned_int>(&local_2138);
  DynamicValue::Reader::~Reader(&local_2138);
  DynamicValue::Reader::~Reader(&local_21b8);
  DynamicValue::Reader::~Reader(&local_2240);
  if (RVar6 != 0x75bcd15) {
    local_2261 = kj::_::Debug::shouldLog(ERROR);
    while (local_2261 != false) {
      local_2268 = 0x75bcd15;
      kj::StringPtr::StringPtr((StringPtr *)&local_23d0,"list32");
      DynamicStruct::Reader::get(&local_23c0,(Reader *)local_40,(StringPtr)local_23d0);
      DynamicValue::Reader::as<capnp::DynamicList>(&local_2378,&local_23c0);
      DynamicList::Reader::operator[](&local_2338,&local_2378,0);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_22f0,&local_2338);
      kj::StringPtr::StringPtr((StringPtr *)&local_23e0,"f");
      DynamicStruct::Reader::get(&local_22b8,&local_22f0,(StringPtr)local_23e0);
      local_226c = DynamicValue::Reader::as<unsigned_int>(&local_22b8);
      kj::_::Debug::log<char_const(&)[147],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x318,ERROR,
                 "\"failed: expected \" \"(123456789u) == (lists.get(\\\"list32\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint32_t>())\", 123456789u, lists.get(\"list32\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint32_t>()"
                 ,(char (*) [147])
                  "failed: expected (123456789u) == (lists.get(\"list32\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint32_t>())"
                 ,&local_2268,&local_226c);
      DynamicValue::Reader::~Reader(&local_22b8);
      DynamicValue::Reader::~Reader(&local_2338);
      DynamicValue::Reader::~Reader(&local_23c0);
      local_2261 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_2540,"list32");
  DynamicStruct::Reader::get(&local_2530,(Reader *)local_40,(StringPtr)local_2540);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_24e8,&local_2530);
  DynamicList::Reader::operator[](&local_24a8,&local_24e8,1);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_2460,&local_24a8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2550,"f");
  DynamicStruct::Reader::get(&local_2428,&local_2460,(StringPtr)_auStack_2550);
  RVar6 = DynamicValue::Reader::as<unsigned_int>(&local_2428);
  DynamicValue::Reader::~Reader(&local_2428);
  DynamicValue::Reader::~Reader(&local_24a8);
  DynamicValue::Reader::~Reader(&local_2530);
  if (RVar6 != 0xdfb38d2) {
    local_2551 = kj::_::Debug::shouldLog(ERROR);
    while (local_2551 != false) {
      local_2558 = 0xdfb38d2;
      kj::StringPtr::StringPtr((StringPtr *)&local_26c0,"list32");
      DynamicStruct::Reader::get(&local_26b0,(Reader *)local_40,(StringPtr)local_26c0);
      DynamicValue::Reader::as<capnp::DynamicList>(&local_2668,&local_26b0);
      DynamicList::Reader::operator[](&local_2628,&local_2668,1);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_25e0,&local_2628);
      kj::StringPtr::StringPtr((StringPtr *)&local_26d0,"f");
      DynamicStruct::Reader::get(&local_25a8,&local_25e0,(StringPtr)local_26d0);
      local_255c = DynamicValue::Reader::as<unsigned_int>(&local_25a8);
      kj::_::Debug::log<char_const(&)[147],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x319,ERROR,
                 "\"failed: expected \" \"(234567890u) == (lists.get(\\\"list32\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint32_t>())\", 234567890u, lists.get(\"list32\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint32_t>()"
                 ,(char (*) [147])
                  "failed: expected (234567890u) == (lists.get(\"list32\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint32_t>())"
                 ,&local_2558,&local_255c);
      DynamicValue::Reader::~Reader(&local_25a8);
      DynamicValue::Reader::~Reader(&local_2628);
      DynamicValue::Reader::~Reader(&local_26b0);
      local_2551 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_2830,"list64");
  DynamicStruct::Reader::get(&local_2820,(Reader *)local_40,(StringPtr)local_2830);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_27d8,&local_2820);
  DynamicList::Reader::operator[](&local_2798,&local_27d8,0);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_2750,&local_2798);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2840,"f");
  DynamicStruct::Reader::get(&local_2718,&local_2750,(StringPtr)_auStack_2840);
  RVar8 = DynamicValue::Reader::as<unsigned_long>(&local_2718);
  DynamicValue::Reader::~Reader(&local_2718);
  DynamicValue::Reader::~Reader(&local_2798);
  DynamicValue::Reader::~Reader(&local_2820);
  if (RVar8 != 0x462d53c8abac0) {
    local_2841 = kj::_::Debug::shouldLog(ERROR);
    while (local_2841 != false) {
      local_2850 = 0x462d53c8abac0;
      kj::StringPtr::StringPtr((StringPtr *)&local_29b8,"list64");
      DynamicStruct::Reader::get(&local_29a8,(Reader *)local_40,(StringPtr)local_29b8);
      DynamicValue::Reader::as<capnp::DynamicList>(&local_2960,&local_29a8);
      DynamicList::Reader::operator[](&local_2920,&local_2960,0);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_28d8,&local_2920);
      kj::StringPtr::StringPtr((StringPtr *)&local_29c8,"f");
      DynamicStruct::Reader::get(&local_28a0,&local_28d8,(StringPtr)local_29c8);
      local_2858 = DynamicValue::Reader::as<unsigned_long>(&local_28a0);
      kj::_::Debug::log<char_const(&)[154],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x31a,ERROR,
                 "\"failed: expected \" \"(1234567890123456u) == (lists.get(\\\"list64\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint64_t>())\", 1234567890123456u, lists.get(\"list64\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint64_t>()"
                 ,(char (*) [154])
                  "failed: expected (1234567890123456u) == (lists.get(\"list64\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint64_t>())"
                 ,&local_2850,&local_2858);
      DynamicValue::Reader::~Reader(&local_28a0);
      DynamicValue::Reader::~Reader(&local_2920);
      DynamicValue::Reader::~Reader(&local_29a8);
      local_2841 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_2b28,"list64");
  DynamicStruct::Reader::get(&local_2b18,(Reader *)local_40,(StringPtr)local_2b28);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_2ad0,&local_2b18);
  DynamicList::Reader::operator[](&local_2a90,&local_2ad0,1);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_2a48,&local_2a90);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2b38,"f");
  DynamicStruct::Reader::get(&local_2a10,&local_2a48,(StringPtr)_auStack_2b38);
  RVar8 = DynamicValue::Reader::as<unsigned_long>(&local_2a10);
  DynamicValue::Reader::~Reader(&local_2a10);
  DynamicValue::Reader::~Reader(&local_2a90);
  DynamicValue::Reader::~Reader(&local_2b18);
  if (RVar8 != 0x85561edaa4b87) {
    local_2b39 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b39 != false) {
      local_2b48 = 0x85561edaa4b87;
      kj::StringPtr::StringPtr((StringPtr *)&local_2cb0,"list64");
      DynamicStruct::Reader::get(&local_2ca0,(Reader *)local_40,(StringPtr)local_2cb0);
      DynamicValue::Reader::as<capnp::DynamicList>(&local_2c58,&local_2ca0);
      DynamicList::Reader::operator[](&local_2c18,&local_2c58,1);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_2bd0,&local_2c18);
      kj::StringPtr::StringPtr((StringPtr *)&local_2cc0,"f");
      DynamicStruct::Reader::get(&local_2b98,&local_2bd0,(StringPtr)local_2cc0);
      local_2b50 = DynamicValue::Reader::as<unsigned_long>(&local_2b98);
      kj::_::Debug::log<char_const(&)[154],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x31b,ERROR,
                 "\"failed: expected \" \"(2345678901234567u) == (lists.get(\\\"list64\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint64_t>())\", 2345678901234567u, lists.get(\"list64\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint64_t>()"
                 ,(char (*) [154])
                  "failed: expected (2345678901234567u) == (lists.get(\"list64\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint64_t>())"
                 ,&local_2b48,&local_2b50);
      DynamicValue::Reader::~Reader(&local_2b98);
      DynamicValue::Reader::~Reader(&local_2c18);
      DynamicValue::Reader::~Reader(&local_2ca0);
      local_2b39 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_2e30,"listP");
  DynamicStruct::Reader::get(&local_2e20,(Reader *)local_40,(StringPtr)local_2e30);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_2dd8,&local_2e20);
  DynamicList::Reader::operator[](&local_2d98,&local_2dd8,0);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_2d50,&local_2d98);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2e40,"f");
  DynamicStruct::Reader::get(&local_2d18,&local_2d50,(StringPtr)_auStack_2e40);
  local_2cd0 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_2d18);
  bVar1 = kj::operator==("foo",(StringPtr *)&local_2cd0);
  DynamicValue::Reader::~Reader(&local_2d18);
  DynamicValue::Reader::~Reader(&local_2d98);
  DynamicValue::Reader::~Reader(&local_2e20);
  if (!bVar1) {
    local_2e41 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e41 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_2fb8,"listP");
      DynamicStruct::Reader::get(&local_2fa8,(Reader *)local_40,(StringPtr)local_2fb8);
      DynamicValue::Reader::as<capnp::DynamicList>(&local_2f60,&local_2fa8);
      DynamicList::Reader::operator[](&local_2f20,&local_2f60,0);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_2ed8,&local_2f20);
      kj::StringPtr::StringPtr((StringPtr *)&local_2fc8,"f");
      DynamicStruct::Reader::get(&local_2ea0,&local_2ed8,(StringPtr)local_2fc8);
      AVar10 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_2ea0);
      local_2e58 = AVar10;
      kj::_::Debug::log<char_const(&)[137],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x31c,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (lists.get(\\\"listP\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<Text>())\", \"foo\", lists.get(\"listP\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<Text>()"
                 ,(char (*) [137])
                  "failed: expected (\"foo\") == (lists.get(\"listP\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<Text>())"
                 ,(char (*) [4])0xa4c8db,(Reader *)&local_2e58);
      DynamicValue::Reader::~Reader(&local_2ea0);
      DynamicValue::Reader::~Reader(&local_2f20);
      DynamicValue::Reader::~Reader(&local_2fa8);
      local_2e41 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_3138,"listP");
  DynamicStruct::Reader::get(&local_3128,(Reader *)local_40,(StringPtr)local_3138);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_30e0,&local_3128);
  DynamicList::Reader::operator[](&local_30a0,&local_30e0,1);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_3058,&local_30a0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_3148,"f");
  DynamicStruct::Reader::get(&local_3020,&local_3058,(StringPtr)_auStack_3148);
  local_2fd8 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_3020);
  bVar1 = kj::operator==("bar",(StringPtr *)&local_2fd8);
  DynamicValue::Reader::~Reader(&local_3020);
  DynamicValue::Reader::~Reader(&local_30a0);
  DynamicValue::Reader::~Reader(&local_3128);
  if (!bVar1) {
    local_3149 = kj::_::Debug::shouldLog(ERROR);
    while (local_3149 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_32c0,"listP");
      DynamicStruct::Reader::get(&local_32b0,(Reader *)local_40,(StringPtr)local_32c0);
      DynamicValue::Reader::as<capnp::DynamicList>(&local_3268,&local_32b0);
      DynamicList::Reader::operator[](&local_3228,&local_3268,1);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_31e0,&local_3228);
      kj::StringPtr::StringPtr((StringPtr *)&l.reader.nestingLimit,"f");
      DynamicStruct::Reader::get(&local_31a8,&local_31e0,(StringPtr)stack0xffffffffffffcd30);
      AVar10 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_31a8);
      local_3160 = AVar10;
      kj::_::Debug::log<char_const(&)[137],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x31d,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (lists.get(\\\"listP\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<Text>())\", \"bar\", lists.get(\"listP\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<Text>()"
                 ,(char (*) [137])
                  "failed: expected (\"bar\") == (lists.get(\"listP\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<Text>())"
                 ,(char (*) [4])0xa54964,(Reader *)&local_3160);
      DynamicValue::Reader::~Reader(&local_31a8);
      DynamicValue::Reader::~Reader(&local_3228);
      DynamicValue::Reader::~Reader(&local_32b0);
      local_3149 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&f_7,"int32ListList");
  DynamicStruct::Reader::get(&local_3358,(Reader *)local_40,(StringPtr)_f_7);
  DynamicValue::Reader::as<capnp::DynamicList>
            ((ReaderFor<capnp::DynamicList> *)local_3310,&local_3358);
  DynamicValue::Reader::~Reader(&local_3358);
  uVar5 = DynamicList::Reader::size((Reader *)local_3310);
  uVar9 = (ulong)uVar5;
  if (uVar5 != 3) {
    local_3374 = 3;
    local_3378 = DynamicList::Reader::size((Reader *)local_3310);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_3370,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x321,FAILED,"(3u) == (l.size())","3u, l.size()",&local_3374,&local_3378);
    kj::_::Debug::Fault::fatal(&local_3370);
  }
  DynamicList::Reader::operator[]((Reader *)(local_33dc + 0x1c),(Reader *)local_3310,0);
  local_33dc._0_4_ = VOID;
  local_33dc._4_4_ = 2;
  local_33dc._8_4_ = 3;
  local_33dc._12_8_ = local_33dc;
  local_33dc._20_8_ = 3;
  expected._M_len = uVar9;
  expected._M_array = (iterator)0x3;
  checkList<int,capnp::DynamicValue::Reader>
            ((_ *)(local_33dc + 0x1c),(Reader *)local_33dc._12_8_,expected);
  DynamicValue::Reader::~Reader((Reader *)(local_33dc + 0x1c));
  DynamicList::Reader::operator[]((Reader *)(local_3440 + 0x18),(Reader *)local_3310,1);
  local_3440._0_4_ = UINT;
  local_3440._4_4_ = 5;
  local_3440._8_8_ = local_3440;
  local_3440._16_8_ = 2;
  expected_00._M_len = uVar9;
  expected_00._M_array = (iterator)0x2;
  checkList<int,capnp::DynamicValue::Reader>
            ((_ *)(local_3440 + 0x18),(Reader *)local_3440._8_8_,expected_00);
  DynamicValue::Reader::~Reader((Reader *)(local_3440 + 0x18));
  DynamicList::Reader::operator[](&local_3488,(Reader *)local_3310,2);
  l_1.reader._44_4_ = 0xbc4ff2;
  expected_01._M_len = uVar9;
  expected_01._M_array = (iterator)0x1;
  checkList<int,capnp::DynamicValue::Reader>
            ((_ *)&local_3488,(Reader *)&l_1.reader.field_0x2c,expected_01);
  DynamicValue::Reader::~Reader(&local_3488);
  kj::StringPtr::StringPtr((StringPtr *)&f_8,"textListList");
  DynamicStruct::Reader::get(&local_3528,(Reader *)local_40,(StringPtr)_f_8);
  DynamicValue::Reader::as<capnp::DynamicList>
            ((ReaderFor<capnp::DynamicList> *)local_34e0,&local_3528);
  DynamicValue::Reader::~Reader(&local_3528);
  uVar5 = DynamicList::Reader::size((Reader *)local_34e0);
  uVar9 = (ulong)uVar5;
  if (uVar5 != 3) {
    local_3544 = 3;
    local_3548 = DynamicList::Reader::size((Reader *)local_34e0);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_3540,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x329,FAILED,"(3u) == (l.size())","3u, l.size()",&local_3544,&local_3548);
    kj::_::Debug::Fault::fatal(&local_3540);
  }
  DynamicList::Reader::operator[](&local_3590,(Reader *)local_34e0,0);
  Text::Reader::Reader((Reader *)local_35c0,"foo");
  Text::Reader::Reader((Reader *)(local_35c0 + 0x10),"bar");
  local_35c0._32_8_ = local_35c0;
  local_35c0._40_8_ = (byte *)0x2;
  expected_02._M_len = uVar9;
  expected_02._M_array = (iterator)0x2;
  checkList<capnp::Text,capnp::DynamicValue::Reader>
            ((_ *)&local_3590,(Reader *)local_35c0._32_8_,expected_02);
  DynamicValue::Reader::~Reader(&local_3590);
  DynamicList::Reader::operator[]((Reader *)(local_3628 + 0x20),(Reader *)local_34e0,1);
  Text::Reader::Reader((Reader *)local_3628,"baz");
  local_3628._16_8_ = local_3628;
  local_3628._24_8_ = (SegmentReader *)0x1;
  expected_03._M_len = uVar9;
  expected_03._M_array = (iterator)0x1;
  checkList<capnp::Text,capnp::DynamicValue::Reader>
            ((_ *)(local_3628 + 0x20),(Reader *)local_3628._16_8_,expected_03);
  DynamicValue::Reader::~Reader((Reader *)(local_3628 + 0x20));
  DynamicList::Reader::operator[](&local_3670,(Reader *)local_34e0,2);
  Text::Reader::Reader((Reader *)&l_2.reader.nestingLimit,"qux");
  Text::Reader::Reader(&local_3690,"corge");
  local_3680 = &l_2.reader.nestingLimit;
  local_3678 = 2;
  expected_04._M_len = uVar9;
  expected_04._M_array = (iterator)0x2;
  checkList<capnp::Text,capnp::DynamicValue::Reader>
            ((_ *)&local_3670,(Reader *)local_3680,expected_04);
  DynamicValue::Reader::~Reader(&local_3670);
  kj::StringPtr::StringPtr((StringPtr *)&f_9,"structListList");
  DynamicStruct::Reader::get(&local_3728,(Reader *)local_40,(StringPtr)_f_9);
  DynamicValue::Reader::as<capnp::DynamicList>
            ((ReaderFor<capnp::DynamicList> *)local_36e0,&local_3728);
  DynamicValue::Reader::~Reader(&local_3728);
  uVar5 = DynamicList::Reader::size((Reader *)local_36e0);
  if (uVar5 != 2) {
    e.reader._44_4_ = 2;
    e.reader.nestingLimit = DynamicList::Reader::size((Reader *)local_36e0);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_3740,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x331,FAILED,"(2u) == (l.size())","2u, l.size()",(uint *)&e.reader.field_0x2c,
               (uint *)&e.reader.nestingLimit);
    kj::_::Debug::Fault::fatal(&local_3740);
  }
  DynamicList::Reader::operator[]((Reader *)&f_10,(Reader *)local_36e0,0);
  DynamicValue::Reader::as<capnp::DynamicList>
            ((ReaderFor<capnp::DynamicList> *)local_3788,(Reader *)&f_10);
  DynamicValue::Reader::~Reader((Reader *)&f_10);
  uVar5 = DynamicList::Reader::size((Reader *)local_3788);
  if (uVar5 != 2) {
    local_37dc = 2;
    local_37e0 = DynamicList::Reader::size((Reader *)local_3788);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_37d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x333,FAILED,"(2u) == (e.size())","2u, e.size()",&local_37dc,&local_37e0);
    kj::_::Debug::Fault::fatal(&local_37d8);
  }
  DynamicList::Reader::operator[]((Reader *)local_3858,(Reader *)local_3788,0);
  DynamicValue::Reader::as<capnproto_test::capnp::test::TestAllTypes>
            (&local_3810,(Reader *)local_3858);
  iVar7 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field(&local_3810);
  DynamicValue::Reader::~Reader((Reader *)local_3858);
  if (iVar7 != 0x7b) {
    local_3859 = kj::_::Debug::shouldLog(ERROR);
    while (local_3859 != false) {
      local_3860 = 0x7b;
      DynamicList::Reader::operator[](&local_38e0,(Reader *)local_3788,0);
      DynamicValue::Reader::as<capnproto_test::capnp::test::TestAllTypes>(&local_3898,&local_38e0);
      local_3864 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field(&local_3898);
      kj::_::Debug::log<char_const(&)[77],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x334,ERROR,
                 "\"failed: expected \" \"(123) == (e[0].template as<TestAllTypes>().getInt32Field())\", 123, e[0].template as<TestAllTypes>().getInt32Field()"
                 ,(char (*) [77])
                  "failed: expected (123) == (e[0].template as<TestAllTypes>().getInt32Field())",
                 &local_3860,&local_3864);
      DynamicValue::Reader::~Reader(&local_38e0);
      local_3859 = false;
    }
  }
  DynamicList::Reader::operator[]((Reader *)local_3958,(Reader *)local_3788,1);
  DynamicValue::Reader::as<capnproto_test::capnp::test::TestAllTypes>
            (&local_3910,(Reader *)local_3958);
  iVar7 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field(&local_3910);
  DynamicValue::Reader::~Reader((Reader *)local_3958);
  if (iVar7 != 0x1c8) {
    local_3959 = kj::_::Debug::shouldLog(ERROR);
    while (local_3959 != false) {
      local_3960 = 0x1c8;
      DynamicList::Reader::operator[](&local_39e0,(Reader *)local_3788,1);
      DynamicValue::Reader::as<capnproto_test::capnp::test::TestAllTypes>(&local_3998,&local_39e0);
      local_3964 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field(&local_3998);
      kj::_::Debug::log<char_const(&)[77],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x335,ERROR,
                 "\"failed: expected \" \"(456) == (e[1].template as<TestAllTypes>().getInt32Field())\", 456, e[1].template as<TestAllTypes>().getInt32Field()"
                 ,(char (*) [77])
                  "failed: expected (456) == (e[1].template as<TestAllTypes>().getInt32Field())",
                 &local_3960,&local_3964);
      DynamicValue::Reader::~Reader(&local_39e0);
      local_3959 = false;
    }
  }
  DynamicList::Reader::operator[]((Reader *)&f_11,(Reader *)local_36e0,1);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_3a20,(Reader *)&f_11);
  memcpy(local_3788,&local_3a20,0x40);
  DynamicValue::Reader::~Reader((Reader *)&f_11);
  uVar5 = DynamicList::Reader::size((Reader *)local_3788);
  if (uVar5 != 1) {
    local_3a74 = 1;
    local_3a78 = DynamicList::Reader::size((Reader *)local_3788);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_3a70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x337,FAILED,"(1u) == (e.size())","1u, e.size()",&local_3a74,&local_3a78);
    kj::_::Debug::Fault::fatal(&local_3a70);
  }
  DynamicList::Reader::operator[]((Reader *)local_3af0,(Reader *)local_3788,0);
  DynamicValue::Reader::as<capnproto_test::capnp::test::TestAllTypes>
            (&local_3aa8,(Reader *)local_3af0);
  iVar7 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field(&local_3aa8);
  DynamicValue::Reader::~Reader((Reader *)local_3af0);
  if (iVar7 != 0x315) {
    local_3af1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3af1 != false) {
      local_3af8 = 0x315;
      DynamicList::Reader::operator[](&local_3b78,(Reader *)local_3788,0);
      DynamicValue::Reader::as<capnproto_test::capnp::test::TestAllTypes>(&local_3b30,&local_3b78);
      local_3afc = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field(&local_3b30);
      kj::_::Debug::log<char_const(&)[77],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x338,ERROR,
                 "\"failed: expected \" \"(789) == (e[0].template as<TestAllTypes>().getInt32Field())\", 789, e[0].template as<TestAllTypes>().getInt32Field()"
                 ,(char (*) [77])
                  "failed: expected (789) == (e[0].template as<TestAllTypes>().getInt32Field())",
                 &local_3af8,&local_3afc);
      DynamicValue::Reader::~Reader(&local_3b78);
      local_3af1 = false;
    }
  }
  return;
}

Assistant:

void dynamicCheckListDefaults(Reader reader) {
  auto lists = reader.get("lists").as<DynamicStruct>();

  ASSERT_EQ(2u, lists.get("list0").as<DynamicList>().size());
  ASSERT_EQ(4u, lists.get("list1").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list8").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list16").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list32").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list64").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("listP").as<DynamicList>().size());

  EXPECT_EQ(VOID, lists.get("list0").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<Void>());
  EXPECT_EQ(VOID, lists.get("list0").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<Void>());
  EXPECT_TRUE(lists.get("list1").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_FALSE(lists.get("list1").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_TRUE(lists.get("list1").as<DynamicList>()[2].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_TRUE(lists.get("list1").as<DynamicList>()[3].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_EQ(123u, lists.get("list8").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint8_t>());
  EXPECT_EQ(45u, lists.get("list8").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint8_t>());
  EXPECT_EQ(12345u, lists.get("list16").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint16_t>());
  EXPECT_EQ(6789u, lists.get("list16").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint16_t>());
  EXPECT_EQ(123456789u, lists.get("list32").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint32_t>());
  EXPECT_EQ(234567890u, lists.get("list32").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint32_t>());
  EXPECT_EQ(1234567890123456u, lists.get("list64").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint64_t>());
  EXPECT_EQ(2345678901234567u, lists.get("list64").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint64_t>());
  EXPECT_EQ("foo", lists.get("listP").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<Text>());
  EXPECT_EQ("bar", lists.get("listP").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<Text>());

  {
    auto l = lists.get("int32ListList").as<DynamicList>();
    ASSERT_EQ(3u, l.size());
    checkList<int32_t>(l[0], {1, 2, 3});
    checkList<int32_t>(l[1], {4, 5});
    checkList<int32_t>(l[2], {12341234});
  }

  {
    auto l = lists.get("textListList").as<DynamicList>();
    ASSERT_EQ(3u, l.size());
    checkList<Text>(l[0], {"foo", "bar"});
    checkList<Text>(l[1], {"baz"});
    checkList<Text>(l[2], {"qux", "corge"});
  }

  {
    auto l = lists.get("structListList").as<DynamicList>();
    ASSERT_EQ(2u, l.size());
    auto e = l[0].as<DynamicList>();
    ASSERT_EQ(2u, e.size());
    EXPECT_EQ(123, e[0].as<TestAllTypes>().getInt32Field());
    EXPECT_EQ(456, e[1].as<TestAllTypes>().getInt32Field());
    e = l[1].as<DynamicList>();
    ASSERT_EQ(1u, e.size());
    EXPECT_EQ(789, e[0].as<TestAllTypes>().getInt32Field());
  }
}